

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfcd.h
# Opt level: O2

UBool icu_63::CollationFCD::hasTccc(UChar32 c)

{
  if ((0xbf < c) && ((ulong)(byte)tcccIndex[(uint)c >> 5] != 0)) {
    return (*(uint *)(tcccBits + (ulong)(byte)tcccIndex[(uint)c >> 5] * 4) >> (c & 0x1fU) & 1) != 0;
  }
  return '\0';
}

Assistant:

static inline UBool hasTccc(UChar32 c) {
        // assert c <= 0xffff
        // c can be negative, e.g., U_SENTINEL from UCharIterator;
        // that is handled in the first test.
        int32_t i;
        return
            // U+00C0 is the first character with tccc!=0.
            c >= 0xc0 &&
            (i = tcccIndex[c >> 5]) != 0 &&
            (tcccBits[i] & ((uint32_t)1 << (c & 0x1f))) != 0;
    }